

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.cpp
# Opt level: O1

BOOL __thiscall
Js::RecyclableObject::Equals
          (RecyclableObject *this,Var aRight,BOOL *value,ScriptContext *requestContext)

{
  long lVar1;
  ulong uVar2;
  PropertyRecord *pPVar3;
  code *pcVar4;
  bool bVar5;
  BOOL BVar6;
  uint uVar7;
  int32 iVar8;
  uint uVar9;
  undefined4 *puVar10;
  RecyclableObject *pRVar11;
  RecyclableObject *pRVar12;
  JavascriptTypedNumber<unsigned_long> *pJVar13;
  JavascriptTypedNumber<long> *pJVar14;
  JavascriptBoolean *pJVar15;
  JavascriptString *aLeft;
  JavascriptString *aRight_00;
  JavascriptSymbol *pJVar16;
  JavascriptSymbolObject *pJVar17;
  PropertyRecord *pPVar18;
  Type TVar19;
  char *message;
  ulong uVar20;
  char *error;
  Type TVar21;
  uint lineNumber;
  int iVar22;
  Type TVar23;
  double dVar24;
  double dVar25;
  RecyclableObject *local_38;
  
  if (this == (RecyclableObject *)aRight) {
    *value = 1;
    return 1;
  }
  TVar23 = ((this->type).ptr)->typeId;
  if (aRight == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar5) goto LAB_00de111c;
    *puVar10 = 0;
  }
  if (((ulong)aRight & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)aRight & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar5) goto LAB_00de111c;
    *puVar10 = 0;
  }
  TVar19 = TypeIds_FirstNumberType;
  if ((((ulong)aRight & 0xffff000000000000) != 0x1000000000000) &&
     (TVar19 = TypeIds_Number, aRight < (Var)0x4000000000000)) {
    pRVar11 = UnsafeVarTo<Js::RecyclableObject>(aRight);
    if (pRVar11 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar5) goto LAB_00de111c;
      *puVar10 = 0;
    }
    TVar19 = ((pRVar11->type).ptr)->typeId;
    if ((0x57 < (int)TVar19) && (BVar6 = IsExternal(pRVar11), BVar6 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar5) {
LAB_00de111c:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar10 = 0;
    }
  }
  puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  uVar9 = 0;
  pRVar11 = this;
  local_38 = (RecyclableObject *)aRight;
LAB_00de0406:
  uVar7 = ~uVar9;
LAB_00de040b:
  iVar22 = (int)pRVar11;
  switch(TVar23) {
  case TypeIds_Undefined:
  case TypeIds_Null:
    if (TVar19 < TypeIds_BigInt) {
      if ((0x118U >> (TVar19 & TypeIds_CopyOnAccessNativeIntArray) & 1) != 0)
      goto switchD_00de0670_caseD_0;
      if ((3U >> (TVar19 & TypeIds_CopyOnAccessNativeIntArray) & 1) != 0) {
        *value = 1;
        return 1;
      }
    }
    this = VarTo<Js::RecyclableObject>(local_38);
    goto LAB_00de0b15;
  case TypeIds_Boolean:
    goto switchD_00de0422_caseD_2;
  case TypeIds_FirstNumberType:
    switch(TVar19) {
    case TypeIds_Undefined:
    case TypeIds_Null:
    case TypeIds_Symbol:
      goto switchD_00de0670_caseD_0;
    case TypeIds_Boolean:
    case TypeIds_String:
      dVar25 = (double)iVar22;
      dVar24 = JavascriptConversion::ToNumber(local_38,requestContext);
      goto LAB_00de0ae2;
    case TypeIds_FirstNumberType:
      uVar9 = (uint)(pRVar11 == local_38);
      goto LAB_00de0b20;
    case TypeIds_Number:
      dVar25 = (double)iVar22;
      goto LAB_00de0a7b;
    case TypeIds_Int64Number:
      iVar8 = TaggedInt::ToInt32(pRVar11);
      pJVar14 = VarTo<Js::JavascriptTypedNumber<long>>(local_38);
      bVar5 = pJVar14->m_value == (long)iVar8;
      *value = (uint)bVar5;
      if (!bVar5) {
        return 1;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      error = "(!(*value))";
      message = "!(*value)";
      lineNumber = 0x23b;
      break;
    case TypeIds_LastNumberType:
      iVar8 = TaggedInt::ToInt32(pRVar11);
      pJVar14 = VarTo<Js::JavascriptTypedNumber<long>>(local_38);
      bVar5 = pJVar14->m_value == (long)iVar8;
      *value = (uint)bVar5;
      if (!bVar5) {
        return 1;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      error = "(!(*value))";
      message = "!(*value)";
      lineNumber = 0x244;
      break;
    default:
      goto switchD_00de0670_caseD_5;
    }
    break;
  case TypeIds_Number:
    switch(TVar19) {
    case TypeIds_Undefined:
    case TypeIds_Null:
    case TypeIds_Symbol:
      goto switchD_00de0670_caseD_0;
    case TypeIds_Boolean:
    case TypeIds_String:
      goto switchD_00de0670_caseD_2;
    case TypeIds_FirstNumberType:
      dVar25 = JavascriptNumber::GetValue(pRVar11);
      dVar24 = (double)(int)local_38;
      goto LAB_00de0ae2;
    case TypeIds_Number:
      dVar25 = JavascriptNumber::GetValue(pRVar11);
LAB_00de0a7b:
      dVar24 = JavascriptNumber::GetValue(local_38);
      goto LAB_00de0ae2;
    default:
      goto switchD_00de0670_caseD_5;
    }
  case TypeIds_Int64Number:
    switch(TVar19) {
    case TypeIds_FirstNumberType:
      pJVar14 = VarTo<Js::JavascriptTypedNumber<long>>(pRVar11);
      lVar1 = pJVar14->m_value;
      iVar8 = TaggedInt::ToInt32(local_38);
      bVar5 = lVar1 == iVar8;
      *value = (uint)bVar5;
      if (!bVar5) {
        return 1;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      error = "(!(*value))";
      message = "!(*value)";
      lineNumber = 0x25c;
      goto LAB_00de0a52;
    case TypeIds_Number:
      pJVar14 = VarTo<Js::JavascriptTypedNumber<long>>(pRVar11);
      dVar25 = (double)pJVar14->m_value;
      goto LAB_00de0a7b;
    case TypeIds_Int64Number:
    case TypeIds_LastNumberType:
      pJVar13 = (JavascriptTypedNumber<unsigned_long> *)
                VarTo<Js::JavascriptTypedNumber<long>>(pRVar11);
LAB_00de09ae:
      TVar21 = pJVar13->m_value;
      pJVar13 = (JavascriptTypedNumber<unsigned_long> *)
                VarTo<Js::JavascriptTypedNumber<long>>(local_38);
LAB_00de09d2:
      bVar5 = TVar21 == pJVar13->m_value;
      goto LAB_00de09d8;
    }
switchD_00de08d6_default:
    pRVar11 = (RecyclableObject *)
              JavascriptConversion::ToPrimitive<(Js::JavascriptHint)0>(pRVar11,requestContext);
    if (pRVar11 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar10 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar5) goto LAB_00de111c;
      *puVar10 = 0;
    }
    if (((ulong)pRVar11 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pRVar11 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar10 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar5) goto LAB_00de111c;
      *puVar10 = 0;
    }
    TVar23 = TypeIds_FirstNumberType;
    if ((((ulong)pRVar11 & 0xffff000000000000) != 0x1000000000000) &&
       (TVar23 = TypeIds_Number, pRVar11 < (RecyclableObject *)0x4000000000000)) {
      pRVar12 = UnsafeVarTo<Js::RecyclableObject>(pRVar11);
      if (pRVar12 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar5) goto LAB_00de111c;
        *puVar10 = 0;
      }
      TVar23 = ((pRVar12->type).ptr)->typeId;
      if ((0x57 < (int)TVar23) && (BVar6 = IsExternal(pRVar12), BVar6 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (bVar5) {
          *puVar10 = 0;
          goto LAB_00de0620;
        }
        goto LAB_00de111c;
      }
    }
LAB_00de0620:
    uVar7 = uVar7 - 1;
    if (uVar7 == 0xfffffffd) goto switchD_00de0670_caseD_0;
    goto LAB_00de040b;
  case TypeIds_LastNumberType:
    switch(TVar19) {
    case TypeIds_FirstNumberType:
      pJVar13 = VarTo<Js::JavascriptTypedNumber<unsigned_long>>(pRVar11);
      TVar21 = pJVar13->m_value;
      iVar8 = TaggedInt::ToInt32(local_38);
      bVar5 = TVar21 == (long)iVar8;
      *value = (uint)(bVar5 && -1 < iVar8);
      if (!bVar5 || -1 >= iVar8) {
        return 1;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      error = "(!(*value))";
      message = "!(*value)";
      lineNumber = 0x27d;
      break;
    case TypeIds_Number:
      pJVar13 = VarTo<Js::JavascriptTypedNumber<unsigned_long>>(pRVar11);
      uVar2 = pJVar13->m_value;
      uVar20 = (ulong)((uint)uVar2 & 1) | uVar2 >> 1;
      if (-1 < (long)uVar2) {
        uVar20 = uVar2;
      }
      dVar24 = (double)(long)uVar20;
      dVar25 = dVar24 + dVar24;
      if (-1 < (long)uVar2) {
        dVar25 = dVar24;
      }
      dVar24 = JavascriptNumber::GetValue(local_38);
      goto LAB_00de0ae2;
    case TypeIds_Int64Number:
      pJVar13 = VarTo<Js::JavascriptTypedNumber<unsigned_long>>(pRVar11);
      goto LAB_00de09ae;
    case TypeIds_LastNumberType:
      pJVar13 = VarTo<Js::JavascriptTypedNumber<unsigned_long>>(pRVar11);
      TVar21 = pJVar13->m_value;
      pJVar13 = VarTo<Js::JavascriptTypedNumber<unsigned_long>>(local_38);
      goto LAB_00de09d2;
    default:
      goto switchD_00de08d6_default;
    }
    break;
  case TypeIds_String:
    if (TypeIds_Symbol < TVar19) goto switchD_00de0670_caseD_5;
    if ((0x1cU >> (TVar19 & TypeIds_CopyOnAccessNativeIntArray) & 1) != 0) goto LAB_00de0b6b;
    if ((0x103U >> (TVar19 & TypeIds_CopyOnAccessNativeIntArray) & 1) != 0)
    goto switchD_00de0670_caseD_0;
    if (TVar19 == TypeIds_String) {
      aLeft = UnsafeVarTo<Js::JavascriptString>(pRVar11);
      aRight_00 = UnsafeVarTo<Js::JavascriptString>(local_38);
      bVar5 = JavascriptString::Equals(aLeft,aRight_00);
      uVar9 = (uint)bVar5;
      goto LAB_00de0b20;
    }
    goto switchD_00de0670_caseD_5;
  case TypeIds_Symbol:
    if ((int)TVar19 < 7) {
      if (TVar19 < TypeIds_Int64Number) goto switchD_00de0670_caseD_0;
      goto switchD_00de0670_caseD_5;
    }
    if (TVar19 == TypeIds_String) goto switchD_00de0670_caseD_0;
    if (TVar19 == TypeIds_SymbolObject) {
      pJVar17 = UnsafeVarTo<Js::JavascriptSymbolObject>(local_38);
      pRVar12 = (RecyclableObject *)JavascriptSymbolObject::Unwrap(pJVar17);
      *value = (uint)(pRVar11 == pRVar12);
      pJVar16 = UnsafeVarTo<Js::JavascriptSymbol>(pRVar11);
      pPVar3 = (pJVar16->propertyRecordUsageCache).propertyRecord.ptr;
      pJVar17 = UnsafeVarTo<Js::JavascriptSymbolObject>(local_38);
      pJVar16 = (pJVar17->value).ptr;
      if (pJVar16 == (JavascriptSymbol *)0x0) {
        pPVar18 = (PropertyRecord *)0x0;
      }
      else {
        pPVar18 = (pJVar16->propertyRecordUsageCache).propertyRecord.ptr;
      }
      if (*value == (uint)(pPVar3 == pPVar18)) {
        return 1;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      error = 
      "((UnsafeVarTo<JavascriptSymbol>(aLeft)->GetValue() == UnsafeVarTo<JavascriptSymbolObject>(aRight)->GetValue()) == *value)"
      ;
      message = 
      "(UnsafeVarTo<JavascriptSymbol>(aLeft)->GetValue() == UnsafeVarTo<JavascriptSymbolObject>(aRight)->GetValue()) == *value"
      ;
      lineNumber = 0x2e5;
    }
    else {
      if (TVar19 != TypeIds_Symbol) goto switchD_00de0670_caseD_5;
      *value = (uint)(pRVar11 == local_38);
      pJVar16 = UnsafeVarTo<Js::JavascriptSymbol>(pRVar11);
      pPVar3 = (pJVar16->propertyRecordUsageCache).propertyRecord.ptr;
      pJVar16 = UnsafeVarTo<Js::JavascriptSymbol>(local_38);
      if (*value == (uint)(pPVar3 == (pJVar16->propertyRecordUsageCache).propertyRecord.ptr)) {
        return 1;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      error = 
      "((UnsafeVarTo<JavascriptSymbol>(aLeft)->GetValue() == UnsafeVarTo<JavascriptSymbol>(aRight)->GetValue()) == *value)"
      ;
      message = 
      "(UnsafeVarTo<JavascriptSymbol>(aLeft)->GetValue() == UnsafeVarTo<JavascriptSymbol>(aRight)->GetValue()) == *value"
      ;
      lineNumber = 0x2e1;
    }
    break;
  default:
    if (TVar19 < TypeIds_BigInt) {
      if ((0x19cU >> (TVar19 & TypeIds_CopyOnAccessNativeIntArray) & 1) != 0)
      goto switchD_00de08d6_default;
      if ((3U >> (TVar19 & TypeIds_CopyOnAccessNativeIntArray) & 1) != 0) {
LAB_00de0b15:
        uVar9 = ((this->type).ptr)->flags & 2;
LAB_00de0b20:
        *value = uVar9;
        return 1;
      }
    }
    goto switchD_00de0670_caseD_0;
  }
LAB_00de0a52:
  bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/RecyclableObject.cpp"
                              ,lineNumber,error,message);
  if (bVar5) {
    *puVar10 = 0;
    return 1;
  }
  goto LAB_00de111c;
switchD_00de0670_caseD_2:
  if (pRVar11 < (RecyclableObject *)0x4000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                ,0xd4,"(Is(aValue))","Ensure var is actually a \'JavascriptNumber\'"
                               );
    if (!bVar5) goto LAB_00de111c;
    *puVar10 = 0;
  }
  if (((ulong)local_38 & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)local_38 & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar5) goto LAB_00de111c;
    *puVar10 = 0;
  }
  dVar25 = (double)((ulong)pRVar11 ^ 0xfffc000000000000);
  if (((ulong)local_38 & 0xffff000000000000) == 0x1000000000000) {
    dVar24 = (double)(int)local_38;
  }
  else {
    if (local_38 < (RecyclableObject *)0x4000000000000) goto LAB_00de0ee9;
    dVar24 = (double)((ulong)local_38 ^ 0xfffc000000000000);
  }
  goto LAB_00de0ae2;
switchD_00de0422_caseD_2:
  if (TVar19 < TypeIds_BigInt) {
    if ((0x98U >> (TVar19 & TypeIds_CopyOnAccessNativeIntArray) & 1) != 0) {
LAB_00de0b6b:
      if (((ulong)pRVar11 & 0x1ffff00000000) != 0x1000000000000 &&
          ((ulong)pRVar11 & 0xffff000000000000) == 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar5) goto LAB_00de111c;
        *puVar10 = 0;
      }
      if (((ulong)pRVar11 & 0xffff000000000000) == 0x1000000000000) {
        dVar25 = (double)iVar22;
      }
      else if (pRVar11 < (RecyclableObject *)0x4000000000000) {
        dVar25 = JavascriptConversion::ToNumber_Full(pRVar11,requestContext);
      }
      else {
        dVar25 = (double)((ulong)pRVar11 ^ 0xfffc000000000000);
      }
      if (((ulong)local_38 & 0x1ffff00000000) != 0x1000000000000 &&
          ((ulong)local_38 & 0xffff000000000000) == 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar5) goto LAB_00de111c;
        *puVar10 = 0;
      }
      if (((ulong)local_38 & 0xffff000000000000) == 0x1000000000000) {
        dVar24 = (double)(int)local_38;
      }
      else if (local_38 < (RecyclableObject *)0x4000000000000) {
LAB_00de0ee9:
        dVar24 = JavascriptConversion::ToNumber_Full(local_38,requestContext);
      }
      else {
        dVar24 = (double)((ulong)local_38 ^ 0xfffc000000000000);
      }
LAB_00de0ae2:
      *value = (uint)(dVar25 == dVar24);
      return 1;
    }
    if ((0x103U >> (TVar19 & TypeIds_CopyOnAccessNativeIntArray) & 1) != 0)
    goto switchD_00de0670_caseD_0;
    if (TVar19 == TypeIds_Boolean) {
      pJVar15 = VarTo<Js::JavascriptBoolean>(pRVar11);
      iVar22 = pJVar15->value;
      pJVar15 = VarTo<Js::JavascriptBoolean>(local_38);
      bVar5 = iVar22 == pJVar15->value;
LAB_00de09d8:
      *value = (uint)bVar5;
      return 1;
    }
  }
switchD_00de0670_caseD_5:
  local_38 = (RecyclableObject *)
             JavascriptConversion::ToPrimitive<(Js::JavascriptHint)0>(local_38,requestContext);
  if (local_38 == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar5) goto LAB_00de111c;
    *puVar10 = 0;
  }
  if (((ulong)local_38 & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)local_38 & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar5) goto LAB_00de111c;
    *puVar10 = 0;
  }
  TVar19 = TypeIds_FirstNumberType;
  if ((((ulong)local_38 & 0xffff000000000000) != 0x1000000000000) &&
     (TVar19 = TypeIds_Number, local_38 < (RecyclableObject *)0x4000000000000)) {
    pRVar12 = UnsafeVarTo<Js::RecyclableObject>(local_38);
    if (pRVar12 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar10 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar5) goto LAB_00de111c;
      *puVar10 = 0;
    }
    TVar19 = ((pRVar12->type).ptr)->typeId;
    if ((0x57 < (int)TVar19) && (BVar6 = IsExternal(pRVar12), BVar6 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar10 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar5) goto LAB_00de111c;
      *puVar10 = 0;
    }
  }
  uVar9 = -uVar7;
  if (uVar7 == 0xfffffffe) {
switchD_00de0670_caseD_0:
    *value = 0;
    return 1;
  }
  goto LAB_00de0406;
}

Assistant:

BOOL RecyclableObject::Equals(__in Var aRight, __out BOOL* value, ScriptContext * requestContext)
    {
        Var aLeft = this;
        if (aLeft == aRight)
        {
            *value = TRUE;
            return TRUE;
        }

        double dblLeft, dblRight;
        TypeId leftType = this->GetTypeId();
        TypeId rightType = JavascriptOperators::GetTypeId(aRight);
        int redoCount = 0;

    Redo:
        if (redoCount == 2)
        {
            goto ReturnFalse;
        }

        switch (leftType)
        {
        case TypeIds_Undefined:
        case TypeIds_Null:
            switch (rightType)
            {
            case TypeIds_Integer:
            case TypeIds_Number:
            case TypeIds_Symbol:
                goto ReturnFalse;
            case TypeIds_Undefined:
            case TypeIds_Null:
                goto ReturnTrue;
            default:
                // Falsy objects are == null and == undefined.
                *value = VarTo<RecyclableObject>(aRight)->GetType()->IsFalsy();
                return TRUE;
            }
        case TypeIds_Integer:
            switch (rightType)
            {
            case TypeIds_Undefined:
            case TypeIds_Null:
            case TypeIds_Symbol:
                goto ReturnFalse;
            case TypeIds_Integer:
                // We already did a check to see if aLeft == aRight above, but we need to check again in case there was a redo.
                *value = aLeft == aRight;
                return TRUE;
            case TypeIds_Int64Number:
            {
                int leftValue = TaggedInt::ToInt32(aLeft);
                __int64 rightValue = VarTo<JavascriptInt64Number>(aRight)->GetValue();
                *value = leftValue == rightValue;
                Assert(!(*value));  // currently it cannot be true. more for future extension if we allow arithmetic calculation
                return TRUE;
            }
            case TypeIds_UInt64Number:
            {
                __int64 leftValue = TaggedInt::ToInt32(aLeft);
                unsigned __int64 rightValue = VarTo<JavascriptInt64Number>(aRight)->GetValue();
                // TODO: yongqu to review whether we need to check for neg value
                *value = (/*leftValue >= 0 && */(unsigned __int64)leftValue == rightValue);
                Assert(!(*value));  // currently it cannot be true. more for future extension if we allow arithmetic calculation
                return TRUE;
            }
            case TypeIds_Number:
                dblLeft = TaggedInt::ToDouble(aLeft);
                dblRight = JavascriptNumber::GetValue(aRight);
                goto CompareDoubles;
            case TypeIds_Boolean:
            case TypeIds_String:
                dblLeft = TaggedInt::ToDouble(aLeft);
                dblRight = JavascriptConversion::ToNumber(aRight, requestContext);
                goto CompareDoubles;
            default:
                goto RedoRight;
            }
            break;
        case TypeIds_Int64Number:
            switch (rightType)
            {
            case TypeIds_Integer:
            {
                __int64 leftValue = VarTo<JavascriptInt64Number>(aLeft)->GetValue();
                int rightValue = TaggedInt::ToInt32(aRight);
                *value = leftValue == rightValue;
                Assert(!(*value));  // currently it cannot be true. more for future extension if we allow arithmetic calculation
                return TRUE;
            }
            case TypeIds_Number:
                dblLeft = (double)VarTo<JavascriptInt64Number>(aLeft)->GetValue();
                dblRight = JavascriptNumber::GetValue(aRight);
                goto CompareDoubles;
            case TypeIds_Int64Number:
            {
                __int64 leftValue = VarTo<JavascriptInt64Number>(aLeft)->GetValue();
                __int64 rightValue = VarTo<JavascriptInt64Number>(aRight)->GetValue();
                *value = leftValue == rightValue;
                return TRUE;
            }
            case TypeIds_UInt64Number:
            {
                __int64 leftValue = VarTo<JavascriptInt64Number>(aLeft)->GetValue();
                unsigned __int64 rightValue = VarTo<JavascriptInt64Number>(aRight)->GetValue();
                // TODO: yongqu to review whether we need to check for neg value
                *value = (/* leftValue >= 0 && */(unsigned __int64)leftValue == rightValue);
                return TRUE;
            }
            }
            break;
        case TypeIds_UInt64Number:
            switch (rightType)
            {
            case TypeIds_Integer:
            {
                unsigned __int64 leftValue = VarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                __int64 rightValue = TaggedInt::ToInt32(aRight);
                // TODO: yongqu to review whether we need to check for neg value
                *value = rightValue >= 0 && leftValue == (unsigned __int64)rightValue;
                Assert(!(*value));  // currently it cannot be true. more for future extension if we allow arithmetic calculation
                return TRUE;
            }
            case TypeIds_Number:
                dblLeft = (double)VarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                dblRight = JavascriptNumber::GetValue(aRight);
                goto CompareDoubles;
            case TypeIds_Int64Number:
            {
                unsigned __int64 leftValue = VarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                __int64 rightValue = VarTo<JavascriptInt64Number>(aRight)->GetValue();
                // TODO: yongqu to review whether we need to check for neg value
                *value = (/* rightValue >= 0 && */leftValue == (unsigned __int64)rightValue);
                return TRUE;
            }
            case TypeIds_UInt64Number:
            {
                unsigned __int64 leftValue = VarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                unsigned __int64 rightValue = VarTo<JavascriptUInt64Number>(aRight)->GetValue();
                *value = leftValue == rightValue;
                return TRUE;
            }
            }
            break;
        case TypeIds_Number:
            switch (rightType)
            {
            case TypeIds_Undefined:
            case TypeIds_Null:
            case TypeIds_Symbol:
                goto ReturnFalse;
            case TypeIds_Integer:
                dblLeft = JavascriptNumber::GetValue(aLeft);
                dblRight = TaggedInt::ToDouble(aRight);
                goto CompareDoubles;
            case TypeIds_Number:
                dblLeft = JavascriptNumber::GetValue(aLeft);
                dblRight = JavascriptNumber::GetValue(aRight);
                goto CompareDoubles;
            case TypeIds_Boolean:
            case TypeIds_String:
                dblLeft = JavascriptNumber::GetValue(aLeft);
                dblRight = JavascriptConversion::ToNumber(aRight, requestContext);
                goto CompareDoubles;
            default:
                goto RedoRight;
            }
            break;
        case TypeIds_String:
            switch (rightType)
            {
            case TypeIds_Undefined:
            case TypeIds_Null:
            case TypeIds_Symbol:
                goto ReturnFalse;
            case TypeIds_String:
                *value = JavascriptString::Equals(UnsafeVarTo<JavascriptString>(aLeft), UnsafeVarTo<JavascriptString>(aRight));
                return TRUE;
            case TypeIds_Number:
            case TypeIds_Integer:
            case TypeIds_Boolean:
                dblLeft = JavascriptConversion::ToNumber(aLeft, requestContext);
                dblRight = JavascriptConversion::ToNumber(aRight, requestContext);
                goto CompareDoubles;
            default:
                goto RedoRight;
            }
        case TypeIds_Boolean:
            switch (rightType)
            {
            case TypeIds_Undefined:
            case TypeIds_Null:
            case TypeIds_Symbol:
                goto ReturnFalse;
            case TypeIds_Boolean:
                *value = VarTo<JavascriptBoolean>(aLeft)->GetValue() == VarTo<JavascriptBoolean>(aRight)->GetValue();
                return TRUE;
            case TypeIds_Number:
            case TypeIds_Integer:
            case TypeIds_String:
                dblLeft = JavascriptConversion::ToNumber(aLeft, requestContext);
                dblRight = JavascriptConversion::ToNumber(aRight, requestContext);
                goto CompareDoubles;
            default:
                goto RedoRight;
            }
            break;

        case TypeIds_Symbol:
            switch (rightType)
            {
            case TypeIds_Undefined:
            case TypeIds_Null:
            case TypeIds_Number:
            case TypeIds_Integer:
            case TypeIds_String:
            case TypeIds_Boolean:
                goto ReturnFalse;
            case TypeIds_Symbol:
                *value = (aLeft == aRight);
                Assert((UnsafeVarTo<JavascriptSymbol>(aLeft)->GetValue() == UnsafeVarTo<JavascriptSymbol>(aRight)->GetValue()) == *value);
                return TRUE;
            case TypeIds_SymbolObject:
                *value = (aLeft == UnsafeVarTo<JavascriptSymbolObject>(aRight)->Unwrap());
                Assert((UnsafeVarTo<JavascriptSymbol>(aLeft)->GetValue() == UnsafeVarTo<JavascriptSymbolObject>(aRight)->GetValue()) == *value);
                return TRUE;
            default:
                goto RedoRight;
            }
            break;

        case TypeIds_Function:
            if (rightType == TypeIds_Function)
            {
                goto ReturnFalse;
            }
            // Fall through to do normal object comparison on function object.
        default:
            switch (rightType)
            {
            case TypeIds_Undefined:
            case TypeIds_Null:
                // Falsy objects are == null and == undefined.
                *value = this->type->IsFalsy();
                return TRUE;
            case TypeIds_Boolean:
            case TypeIds_Integer:
            case TypeIds_Number:
            case TypeIds_String:
            case TypeIds_Symbol:
                goto RedoLeft;
            default:
                goto ReturnFalse;
            }
        }

    RedoLeft:
        aLeft = JavascriptConversion::ToPrimitive<JavascriptHint::None>(aLeft, requestContext);
        leftType = JavascriptOperators::GetTypeId(aLeft);
        redoCount++;
        goto Redo;
    RedoRight:
        aRight = JavascriptConversion::ToPrimitive<JavascriptHint::None>(aRight, requestContext);
        rightType = JavascriptOperators::GetTypeId(aRight);
        redoCount++;
        goto Redo;
    CompareDoubles:
        *value = dblLeft == dblRight;
        return TRUE;
    ReturnFalse:
        *value = FALSE;
        return TRUE;
    ReturnTrue:
        *value = TRUE;
        return TRUE;
    }